

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> * __thiscall
udpdiscovery::impl::PeerEnv::ListDiscovered_abi_cxx11_
          (list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
           *__return_storage_ptr__,PeerEnv *this)

{
  PeerEnv *this_local;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *result;
  
  std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
  list(__return_storage_ptr__);
  MinimalisticMutex::Lock(&this->lock_);
  std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
  operator=(__return_storage_ptr__,&this->discovered_peers_);
  MinimalisticMutex::Unlock(&this->lock_);
  return __return_storage_ptr__;
}

Assistant:

std::list<DiscoveredPeer> ListDiscovered() {
    std::list<DiscoveredPeer> result;

    lock_.Lock();
    result = discovered_peers_;
    lock_.Unlock();

    return result;
  }